

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AtomType.cpp
# Opt level: O0

void __thiscall
OpenMD::AtomType::addProperty(AtomType *this,shared_ptr<OpenMD::GenericData> *genData)

{
  mapped_type_conflict1 *pmVar1;
  long in_RDI;
  shared_ptr<OpenMD::GenericData> *in_stack_00000058;
  PropertyMap *in_stack_00000060;
  GenericData *in_stack_ffffffffffffff68;
  key_type *in_stack_ffffffffffffffa8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  *in_stack_ffffffffffffffb0;
  string local_30 [48];
  
  std::__shared_ptr_access<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x32b224);
  GenericData::getID_abi_cxx11_(in_stack_ffffffffffffff68);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
           ::operator[](in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  *pmVar1 = true;
  std::__cxx11::string::~string(local_30);
  std::shared_ptr<OpenMD::GenericData>::shared_ptr
            ((shared_ptr<OpenMD::GenericData> *)(in_RDI + 0xc0),
             (shared_ptr<OpenMD::GenericData> *)in_stack_ffffffffffffff68);
  PropertyMap::addProperty(in_stack_00000060,in_stack_00000058);
  std::shared_ptr<OpenMD::GenericData>::~shared_ptr((shared_ptr<OpenMD::GenericData> *)0x32b29d);
  return;
}

Assistant:

void AtomType::addProperty(std::shared_ptr<GenericData> genData) {
    myResponsibilities_[genData->getID()] = true;
    properties_.addProperty(genData);
  }